

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O3

int FS_CheckInventory(AActor *activator,char *type)

{
  int iVar1;
  PClassActor *type_00;
  AInventory *pAVar2;
  
  if (activator == (AActor *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = strcmp(type,"Armor");
    if (iVar1 == 0) {
      type = "BasicArmor";
    }
    else {
      iVar1 = strcmp(type,"Health");
      if (iVar1 == 0) {
        return activator->health;
      }
    }
    type_00 = PClass::FindActor(type);
    iVar1 = 0;
    pAVar2 = AActor::FindInventory(activator,type_00,false);
    if (pAVar2 != (AInventory *)0x0) {
      iVar1 = pAVar2->Amount;
    }
  }
  return iVar1;
}

Assistant:

static int FS_CheckInventory (AActor *activator, const char *type)
{
	if (activator == NULL)
		return 0;

	if (strcmp (type, "Armor") == 0)
	{
		type = "BasicArmor";
	}
	else if (strcmp (type, "Health") == 0)
	{
		return activator->health;
	}

	PClassActor *info = PClass::FindActor (type);
	AInventory *item = activator->FindInventory (info);
	return item ? item->Amount : 0;
}